

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O2

void __thiscall
IntrusiveList<SynIdentifier>::push_back(IntrusiveList<SynIdentifier> *this,SynIdentifier *node)

{
  uint __line;
  SynIdentifier **ppSVar1;
  char *__assertion;
  bool bVar2;
  
  if (node == (SynIdentifier *)0x0) {
    __assertion = "node";
    __line = 0xf;
  }
  else if ((node->super_SynBase).next == (SynBase *)0x0) {
    if ((node->super_SynBase).listed != true) {
      (node->super_SynBase).listed = true;
      bVar2 = this->head != (SynIdentifier *)0x0;
      ppSVar1 = (SynIdentifier **)&(this->tail->super_SynBase).next;
      if (!bVar2) {
        ppSVar1 = &this->tail;
      }
      *ppSVar1 = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assertion = "!node->listed";
    __line = 0x11;
  }
  else {
    __assertion = "node->next == 0";
    __line = 0x10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,__line,"void IntrusiveList<SynIdentifier>::push_back(T *) [T = SynIdentifier]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}